

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

void matchTok(int t)

{
  char msg [100];
  char acStack_78 [104];
  
  if (lookahead == t) {
    lookahead = lexan();
  }
  else {
    describeLookahead(acStack_78,"improper syntax ");
    errmsg(acStack_78);
    sprintf(acStack_78,"expect match code: %d",(ulong)(uint)t);
    errmsg(acStack_78);
    ParseError = 1;
  }
  return;
}

Assistant:

void matchTok(int t) {
   if (lookahead == t) {
      lookahead = lexan();
   }
   else {
        char msg[100];
        describeLookahead(msg,"improper syntax ");
	errmsg(msg);
        sprintf(msg,"expect match code: %d", t);
        errmsg(msg);
	ParseError = TRUE;
   }
}